

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

void uv__poll_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv__queue *puVar1;
  byte bVar2;
  int pevents;
  uv_poll_t *handle;
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if (((events & 8) == 0) || ((events & 2) != 0)) {
    bVar2 = (events & 1) != 0;
    if ((events & 2) != 0) {
      bVar2 = bVar2 | 8;
    }
    if ((events & 4) != 0) {
      bVar2 = bVar2 | 2;
    }
    if ((events & 0x2000) != 0) {
      bVar2 = bVar2 | 4;
    }
    (**(code **)&w[-1].fd)(&w[-2].pending_queue,0,bVar2);
  }
  else {
    uv__io_stop(loop,w,0x2007);
    if (((w[-1].pevents & 4) != 0) &&
       (w[-1].pevents = w[-1].pevents & 0xfffffffb, (w[-1].pevents & 8) != 0)) {
      puVar1 = w[-2].pending_queue.prev;
      *(int *)&puVar1->prev = *(int *)&puVar1->prev + -1;
    }
    (**(code **)&w[-1].fd)(&w[-2].pending_queue,0xfffffff7,0);
  }
  return;
}

Assistant:

static void uv__poll_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_poll_t* handle;
  int pevents;

  handle = container_of(w, uv_poll_t, io_watcher);

  /*
   * As documented in the kernel source fs/kernfs/file.c #780
   * poll will return POLLERR|POLLPRI in case of sysfs
   * polling. This does not happen in case of out-of-band
   * TCP messages.
   *
   * The above is the case on (at least) FreeBSD and Linux.
   *
   * So to properly determine a POLLPRI or a POLLERR we need
   * to check for both.
   */
  if ((events & POLLERR) && !(events & UV__POLLPRI)) {
    uv__io_stop(loop, w, POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);
    uv__handle_stop(handle);
    handle->poll_cb(handle, UV_EBADF, 0);
    return;
  }

  pevents = 0;
  if (events & POLLIN)
    pevents |= UV_READABLE;
  if (events & UV__POLLPRI)
    pevents |= UV_PRIORITIZED;
  if (events & POLLOUT)
    pevents |= UV_WRITABLE;
  if (events & UV__POLLRDHUP)
    pevents |= UV_DISCONNECT;

  handle->poll_cb(handle, 0, pevents);
}